

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_splitter.cpp
# Opt level: O0

void __thiscall
MeshSplitter::SplitMesh
          (MeshSplitter *this,uint a,aiMesh *in_mesh,
          vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          *source_mesh_map)

{
  uint uVar1;
  undefined8 uVar2;
  pointer ppVar3;
  undefined1 auVar4 [16];
  undefined4 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  *pvVar21;
  bool bVar22;
  uint uVar23;
  VertexWeightTable *pVVar24;
  aiMesh *this_00;
  aiBone **ppaVar25;
  iterator __first;
  iterator __last;
  aiColor4D *paVar26;
  aiVector3D *paVar27;
  reference pvVar28;
  uint *puVar29;
  reference ppVar30;
  aiBone *paVar31;
  aiVertexWeight *paVar32;
  reference __src;
  size_type sVar33;
  ulong uVar34;
  size_type *psVar35;
  reference pvVar36;
  VertexWeightTable *this_01;
  undefined8 *puVar37;
  pointer ppVar38;
  aiFace *paVar39;
  ulong uVar40;
  pair<aiMesh_*,_unsigned_int> pVar41;
  aiFace *local_7a8;
  aiVertexWeight *local_760;
  aiVector3t<float> *local_6e0;
  aiColor4t<float> *local_6b0;
  aiVector3t<float> *local_680;
  aiVector3t<float> *local_658;
  aiVector3t<float> *local_628;
  aiVector3t<float> *local_5f8;
  int local_594;
  value_type local_580;
  uint local_570;
  undefined1 local_56c [4];
  uint p;
  aiBone *local_168;
  aiBone *bone_out;
  aiBone *bone_in;
  BoneWeightList *weight_list_1;
  aiBone **ppaStack_148;
  uint k;
  aiBone **ppCurrent;
  aiBone *local_138;
  BoneWeightList *weight_list;
  __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  local_128;
  const_iterator end;
  __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  local_118;
  const_iterator iter;
  VertexWeightTable *table;
  uint c_3;
  uint c_2;
  uint index_1;
  uint v_1;
  aiFace *rFace;
  uint local_e0;
  uint local_dc;
  uint index;
  uint v;
  uint iNeed;
  uint iNumIndices;
  uint c_1;
  uint c;
  vector<aiFace,_std::allocator<aiFace>_> vFaces;
  aiMesh *local_98;
  aiMesh *out_mesh;
  uint out_vertex_index;
  uint base;
  uint size_estimated;
  value_type_conflict1 local_74;
  undefined1 local_70 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> was_copied_to;
  uint sub_meshes;
  VertexWeightTable *avPerVertexWeights;
  value_type local_38;
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  *local_28;
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  *source_mesh_map_local;
  aiMesh *in_mesh_local;
  MeshSplitter *pMStack_10;
  uint a_local;
  MeshSplitter *this_local;
  
  local_28 = source_mesh_map;
  source_mesh_map_local =
       (vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
        *)in_mesh;
  in_mesh_local._4_4_ = a;
  pMStack_10 = this;
  if (this->LIMIT < in_mesh->mNumVertices) {
    pVVar24 = ComputeVertexBoneWeightTable(in_mesh);
    was_copied_to.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         *(uint *)((long)&(source_mesh_map_local->
                          super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 4) / this->LIMIT + 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
    local_74 = 0xffffffff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,
               (ulong)*(uint *)((long)&(source_mesh_map_local->
                                       super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 4),&local_74);
    uVar23 = *(uint *)&(source_mesh_map_local->
                       super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish /
             was_copied_to.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
    out_vertex_index = (uVar23 >> 3) + uVar23;
    out_mesh._4_4_ = 0;
    do {
      out_mesh._0_4_ = this->LIMIT;
      this_00 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(this_00);
      this_00->mNumVertices = 0;
      this_00->mMaterialIndex =
           *(uint *)&source_mesh_map_local[9].
                     super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_98 = this_00;
      aiString::operator=(&this_00->mName,
                          (aiString *)
                          ((long)&source_mesh_map_local[9].
                                  super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      bVar22 = aiMesh::HasBones((aiMesh *)source_mesh_map_local);
      if (bVar22) {
        uVar34 = (ulong)*(uint *)&source_mesh_map_local[9].
                                  super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start << 3;
        ppaVar25 = (aiBone **)operator_new__(uVar34);
        memset(ppaVar25,0,uVar34);
        local_98->mBones = ppaVar25;
      }
      if (out_mesh._4_4_ != 0) {
        __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
        __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
        vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 0xffffffff;
        std::
        fill<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                  ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )__first._M_current,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )__last._M_current,
                   (uint *)((long)&vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      }
      std::vector<aiFace,_std::allocator<aiFace>_>::vector
                ((vector<aiFace,_std::allocator<aiFace>_> *)&c_1);
      bVar22 = aiMesh::HasPositions((aiMesh *)source_mesh_map_local);
      if (bVar22) {
        uVar34 = (ulong)(uint)out_mesh;
        paVar27 = (aiVector3D *)operator_new__(uVar34 * 0xc);
        if (uVar34 != 0) {
          local_5f8 = paVar27;
          do {
            aiVector3t<float>::aiVector3t(local_5f8);
            local_5f8 = local_5f8 + 1;
          } while (local_5f8 != paVar27 + uVar34);
        }
        local_98->mVertices = paVar27;
      }
      bVar22 = aiMesh::HasNormals((aiMesh *)source_mesh_map_local);
      if (bVar22) {
        uVar34 = (ulong)(uint)out_mesh;
        paVar27 = (aiVector3D *)operator_new__(uVar34 * 0xc);
        if (uVar34 != 0) {
          local_628 = paVar27;
          do {
            aiVector3t<float>::aiVector3t(local_628);
            local_628 = local_628 + 1;
          } while (local_628 != paVar27 + uVar34);
        }
        local_98->mNormals = paVar27;
      }
      bVar22 = aiMesh::HasTangentsAndBitangents((aiMesh *)source_mesh_map_local);
      if (bVar22) {
        uVar34 = (ulong)(uint)out_mesh;
        paVar27 = (aiVector3D *)operator_new__(uVar34 * 0xc);
        if (uVar34 != 0) {
          local_658 = paVar27;
          do {
            aiVector3t<float>::aiVector3t(local_658);
            local_658 = local_658 + 1;
          } while (local_658 != paVar27 + uVar34);
        }
        local_98->mTangents = paVar27;
        uVar34 = (ulong)(uint)out_mesh;
        paVar27 = (aiVector3D *)operator_new__(uVar34 * 0xc);
        if (uVar34 != 0) {
          local_680 = paVar27;
          do {
            aiVector3t<float>::aiVector3t(local_680);
            local_680 = local_680 + 1;
          } while (local_680 != paVar27 + uVar34);
        }
        local_98->mBitangents = paVar27;
      }
      iNumIndices = 0;
      while (bVar22 = aiMesh::HasVertexColors((aiMesh *)source_mesh_map_local,iNumIndices), bVar22)
      {
        uVar34 = (ulong)(uint)out_mesh;
        paVar26 = (aiColor4D *)operator_new__(uVar34 << 4);
        if (uVar34 != 0) {
          local_6b0 = paVar26;
          do {
            aiColor4t<float>::aiColor4t(local_6b0);
            local_6b0 = local_6b0 + 1;
          } while (local_6b0 != paVar26 + uVar34);
        }
        local_98->mColors[iNumIndices] = paVar26;
        iNumIndices = iNumIndices + 1;
      }
      iNeed = 0;
      while (bVar22 = aiMesh::HasTextureCoords((aiMesh *)source_mesh_map_local,iNeed), bVar22) {
        local_98->mNumUVComponents[iNeed] =
             *(uint *)((long)&source_mesh_map_local[7].
                              super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + (ulong)iNeed * 4);
        uVar34 = (ulong)(uint)out_mesh;
        paVar27 = (aiVector3D *)operator_new__(uVar34 * 0xc);
        if (uVar34 != 0) {
          local_6e0 = paVar27;
          do {
            aiVector3t<float>::aiVector3t(local_6e0);
            local_6e0 = local_6e0 + 1;
          } while (local_6e0 != paVar27 + uVar34);
        }
        local_98->mTextureCoords[iNeed] = paVar27;
        iNeed = iNeed + 1;
      }
      std::vector<aiFace,_std::allocator<aiFace>_>::reserve
                ((vector<aiFace,_std::allocator<aiFace>_> *)&c_1,(ulong)out_vertex_index);
      do {
        if (*(uint *)&(source_mesh_map_local->
                      super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish <= out_mesh._4_4_) break;
        v = *(uint *)&source_mesh_map_local[8].
                      super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[out_mesh._4_4_].first;
        index = 0;
        for (local_dc = 0; local_dc < v; local_dc = local_dc + 1) {
          local_e0 = *(uint *)(*(long *)&source_mesh_map_local[8].
                                         super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         [out_mesh._4_4_].second + (ulong)local_dc * 4);
          pvVar28 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,
                               (ulong)local_e0);
          if (*pvVar28 == 0xffffffff) {
            index = index + 1;
          }
        }
        if ((uint)out_mesh < local_98->mNumVertices + index) break;
        aiFace::aiFace((aiFace *)&rFace);
        std::vector<aiFace,_std::allocator<aiFace>_>::push_back
                  ((vector<aiFace,_std::allocator<aiFace>_> *)&c_1,(aiFace *)&rFace);
        aiFace::~aiFace((aiFace *)&rFace);
        pvVar36 = std::vector<aiFace,_std::allocator<aiFace>_>::back
                            ((vector<aiFace,_std::allocator<aiFace>_> *)&c_1);
        pvVar36->mNumIndices = v;
        puVar29 = (uint *)operator_new__((ulong)v << 2);
        pvVar36->mIndices = puVar29;
        uVar23 = pvVar36->mNumIndices;
        if (uVar23 == 1) {
          local_98->mPrimitiveTypes = local_98->mPrimitiveTypes | 1;
        }
        else if (uVar23 == 2) {
          local_98->mPrimitiveTypes = local_98->mPrimitiveTypes | 2;
        }
        else if (uVar23 == 3) {
          local_98->mPrimitiveTypes = local_98->mPrimitiveTypes | 4;
        }
        else {
          local_98->mPrimitiveTypes = local_98->mPrimitiveTypes | 8;
        }
        for (c_2 = 0; c_2 < v; c_2 = c_2 + 1) {
          uVar23 = *(uint *)(*(long *)&source_mesh_map_local[8].
                                       super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage
                                       [out_mesh._4_4_].second + (ulong)c_2 * 4);
          pvVar28 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,
                               (ulong)uVar23);
          if (*pvVar28 == 0xffffffff) {
            ppVar38 = (source_mesh_map_local->
                      super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage;
            paVar27 = local_98->mVertices;
            uVar1 = local_98->mNumVertices;
            paVar27[uVar1].z = (float)(&ppVar38->second)[(ulong)uVar23 * 3];
            uVar2 = *(undefined8 *)((long)&ppVar38->first + (ulong)uVar23 * 0xc);
            paVar27 = paVar27 + uVar1;
            paVar27->x = (float)(int)uVar2;
            paVar27->y = (float)(int)((ulong)uVar2 >> 0x20);
            bVar22 = aiMesh::HasNormals((aiMesh *)source_mesh_map_local);
            if (bVar22) {
              puVar37 = (undefined8 *)
                        ((long)&(source_mesh_map_local[1].
                                 super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->first +
                        (ulong)uVar23 * 0xc);
              paVar27 = local_98->mNormals + local_98->mNumVertices;
              uVar2 = *puVar37;
              paVar27->x = (float)(int)uVar2;
              paVar27->y = (float)(int)((ulong)uVar2 >> 0x20);
              paVar27->z = *(float *)(puVar37 + 1);
            }
            bVar22 = aiMesh::HasTangentsAndBitangents((aiMesh *)source_mesh_map_local);
            if (bVar22) {
              puVar37 = (undefined8 *)
                        ((long)&(source_mesh_map_local[1].
                                 super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish)->first +
                        (ulong)uVar23 * 0xc);
              paVar27 = local_98->mTangents + local_98->mNumVertices;
              uVar2 = *puVar37;
              paVar27->x = (float)(int)uVar2;
              paVar27->y = (float)(int)((ulong)uVar2 >> 0x20);
              paVar27->z = *(float *)(puVar37 + 1);
              puVar37 = (undefined8 *)
                        ((long)&(source_mesh_map_local[1].
                                 super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->first +
                        (ulong)uVar23 * 0xc);
              paVar27 = local_98->mBitangents + local_98->mNumVertices;
              uVar2 = *puVar37;
              paVar27->x = (float)(int)uVar2;
              paVar27->y = (float)(int)((ulong)uVar2 >> 0x20);
              paVar27->z = *(float *)(puVar37 + 1);
            }
            for (table._4_4_ = 0; table._4_4_ < 8; table._4_4_ = table._4_4_ + 1) {
              bVar22 = aiMesh::HasTextureCoords((aiMesh *)source_mesh_map_local,table._4_4_);
              if (bVar22) {
                puVar37 = (undefined8 *)
                          ((long)&(&source_mesh_map_local[4].
                                    super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)[table._4_4_]
                                  ->first + (ulong)uVar23 * 0xc);
                paVar27 = local_98->mTextureCoords[table._4_4_] + local_98->mNumVertices;
                uVar2 = *puVar37;
                paVar27->x = (float)(int)uVar2;
                paVar27->y = (float)(int)((ulong)uVar2 >> 0x20);
                paVar27->z = *(float *)(puVar37 + 1);
              }
            }
            for (table._0_4_ = 0; (uint)table < 8; table._0_4_ = (uint)table + 1) {
              bVar22 = aiMesh::HasVertexColors((aiMesh *)source_mesh_map_local,(uint)table);
              if (bVar22) {
                ppVar38 = (&source_mesh_map_local[2].
                            super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)[(uint)table] + uVar23;
                paVar26 = local_98->mColors[(uint)table] + local_98->mNumVertices;
                *(aiMesh **)paVar26 = ppVar38->first;
                uVar5 = *(undefined4 *)&ppVar38->field_0xc;
                paVar26->b = (float)ppVar38->second;
                paVar26->a = (float)uVar5;
              }
            }
            pvVar36->mIndices[c_2] = local_98->mNumVertices;
            if (pVVar24 != (VertexWeightTable *)0x0) {
              iter._M_current = (pair<unsigned_int,_float> *)(pVVar24 + local_98->mNumVertices);
              end._M_current =
                   (pair<unsigned_int,_float> *)
                   std::
                   vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   ::begin((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            *)iter._M_current);
              __gnu_cxx::
              __normal_iterator<std::pair<unsigned_int,float>const*,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>
              ::__normal_iterator<std::pair<unsigned_int,float>*>
                        ((__normal_iterator<std::pair<unsigned_int,float>const*,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>
                          *)&local_118,
                         (__normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                          *)&end);
              weight_list = (BoneWeightList *)
                            std::
                            vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            ::end((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                   *)iter._M_current);
              __gnu_cxx::
              __normal_iterator<std::pair<unsigned_int,float>const*,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>
              ::__normal_iterator<std::pair<unsigned_int,float>*>
                        ((__normal_iterator<std::pair<unsigned_int,float>const*,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>
                          *)&local_128,
                         (__normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                          *)&weight_list);
              while (bVar22 = __gnu_cxx::operator!=(&local_118,&local_128), bVar22) {
                ppaVar25 = local_98->mBones;
                ppVar30 = __gnu_cxx::
                          __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                          ::operator*(&local_118);
                local_138 = ppaVar25[ppVar30->first];
                if (local_138 == (aiBone *)0x0) {
                  paVar31 = (aiBone *)operator_new(0x18);
                  memset(paVar31,0,0x18);
                  std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::vector
                            ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)paVar31);
                  ppaVar25 = local_98->mBones;
                  local_138 = paVar31;
                  ppVar30 = __gnu_cxx::
                            __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                            ::operator*(&local_118);
                  ppaVar25[ppVar30->first] = paVar31;
                }
                paVar31 = local_138;
                uVar1 = local_98->mNumVertices;
                ppVar30 = __gnu_cxx::
                          __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                          ::operator*(&local_118);
                aiVertexWeight::aiVertexWeight((aiVertexWeight *)&ppCurrent,uVar1,ppVar30->second);
                std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back
                          ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)paVar31,
                           (value_type *)&ppCurrent);
                __gnu_cxx::
                __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                ::operator++(&local_118);
              }
            }
            uVar1 = local_98->mNumVertices;
            pvVar28 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,
                                 (ulong)uVar23);
            *pvVar28 = uVar1;
            local_98->mNumVertices = local_98->mNumVertices + 1;
          }
          else {
            pvVar28 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,
                                 (ulong)uVar23);
            pvVar36->mIndices[c_2] = *pvVar28;
          }
        }
        out_mesh._4_4_ = out_mesh._4_4_ + 1;
      } while (local_98->mNumVertices != (uint)out_mesh);
      bVar22 = aiMesh::HasBones((aiMesh *)source_mesh_map_local);
      if (bVar22) {
        ppaStack_148 = local_98->mBones;
        for (weight_list_1._4_4_ = 0;
            weight_list_1._4_4_ <
            *(uint *)&source_mesh_map_local[9].
                      super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            weight_list_1._4_4_ = weight_list_1._4_4_ + 1) {
          bone_in = local_98->mBones[weight_list_1._4_4_];
          if (bone_in != (aiBone *)0x0) {
            bone_out = (aiBone *)
                       (&(source_mesh_map_local[9].
                          super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->first)[weight_list_1._4_4_];
            paVar31 = (aiBone *)operator_new(0x460);
            aiBone::aiBone(paVar31);
            *ppaStack_148 = paVar31;
            local_168 = paVar31;
            ppaStack_148 = ppaStack_148 + 1;
            aiString::aiString((aiString *)local_56c,&bone_out->mName);
            aiString::operator=(&local_168->mName,(aiString *)local_56c);
            fVar17 = (bone_out->mOffsetMatrix).a1;
            fVar18 = (bone_out->mOffsetMatrix).a2;
            fVar19 = (bone_out->mOffsetMatrix).a3;
            fVar20 = (bone_out->mOffsetMatrix).a4;
            fVar13 = (bone_out->mOffsetMatrix).b1;
            fVar14 = (bone_out->mOffsetMatrix).b2;
            fVar15 = (bone_out->mOffsetMatrix).b3;
            fVar16 = (bone_out->mOffsetMatrix).b4;
            fVar9 = (bone_out->mOffsetMatrix).c1;
            fVar10 = (bone_out->mOffsetMatrix).c2;
            fVar11 = (bone_out->mOffsetMatrix).c3;
            fVar12 = (bone_out->mOffsetMatrix).c4;
            fVar6 = (bone_out->mOffsetMatrix).d2;
            fVar7 = (bone_out->mOffsetMatrix).d3;
            fVar8 = (bone_out->mOffsetMatrix).d4;
            (local_168->mOffsetMatrix).d1 = (bone_out->mOffsetMatrix).d1;
            (local_168->mOffsetMatrix).d2 = fVar6;
            (local_168->mOffsetMatrix).d3 = fVar7;
            (local_168->mOffsetMatrix).d4 = fVar8;
            (local_168->mOffsetMatrix).c1 = fVar9;
            (local_168->mOffsetMatrix).c2 = fVar10;
            (local_168->mOffsetMatrix).c3 = fVar11;
            (local_168->mOffsetMatrix).c4 = fVar12;
            (local_168->mOffsetMatrix).b1 = fVar13;
            (local_168->mOffsetMatrix).b2 = fVar14;
            (local_168->mOffsetMatrix).b3 = fVar15;
            (local_168->mOffsetMatrix).b4 = fVar16;
            (local_168->mOffsetMatrix).a1 = fVar17;
            (local_168->mOffsetMatrix).a2 = fVar18;
            (local_168->mOffsetMatrix).a3 = fVar19;
            (local_168->mOffsetMatrix).a4 = fVar20;
            sVar33 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size
                               ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)bone_in);
            local_168->mNumWeights = (uint)sVar33;
            uVar34 = (ulong)local_168->mNumWeights;
            paVar32 = (aiVertexWeight *)operator_new__(uVar34 << 3);
            if (uVar34 != 0) {
              local_760 = paVar32;
              do {
                aiVertexWeight::aiVertexWeight(local_760);
                local_760 = local_760 + 1;
              } while (local_760 != paVar32 + uVar34);
            }
            local_168->mWeights = paVar32;
            paVar32 = local_168->mWeights;
            __src = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::operator[]
                              ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)bone_in,0)
            ;
            memcpy(paVar32,__src,(ulong)local_168->mNumWeights << 3);
            paVar31 = bone_in;
            if (bone_in != (aiBone *)0x0) {
              std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::~vector
                        ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)bone_in);
              operator_delete(paVar31,0x18);
            }
            local_98->mNumBones = local_98->mNumBones + 1;
          }
        }
      }
      sVar33 = std::vector<aiFace,_std::allocator<aiFace>_>::size
                         ((vector<aiFace,_std::allocator<aiFace>_> *)&c_1);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = sVar33;
      uVar34 = SUB168(auVar4 * ZEXT816(0x10),0);
      uVar40 = uVar34 + 8;
      if (0xfffffffffffffff7 < uVar34) {
        uVar40 = 0xffffffffffffffff;
      }
      if (SUB168(auVar4 * ZEXT816(0x10),8) != 0) {
        uVar40 = 0xffffffffffffffff;
      }
      psVar35 = (size_type *)operator_new__(uVar40);
      *psVar35 = sVar33;
      paVar39 = (aiFace *)(psVar35 + 1);
      if (sVar33 != 0) {
        local_7a8 = paVar39;
        do {
          aiFace::aiFace(local_7a8);
          local_7a8 = local_7a8 + 1;
        } while (local_7a8 != paVar39 + sVar33);
      }
      local_98->mFaces = paVar39;
      sVar33 = std::vector<aiFace,_std::allocator<aiFace>_>::size
                         ((vector<aiFace,_std::allocator<aiFace>_> *)&c_1);
      local_98->mNumFaces = (uint)sVar33;
      for (local_570 = 0; pvVar21 = local_28, local_570 < local_98->mNumFaces;
          local_570 = local_570 + 1) {
        pvVar36 = std::vector<aiFace,_std::allocator<aiFace>_>::operator[]
                            ((vector<aiFace,_std::allocator<aiFace>_> *)&c_1,(ulong)local_570);
        aiFace::operator=(local_98->mFaces + local_570,pvVar36);
      }
      pVar41 = std::make_pair<aiMesh*&,unsigned_int&>(&local_98,(uint *)((long)&in_mesh_local + 4));
      local_580.first = pVar41.first;
      local_580.second = pVar41.second;
      std::
      vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
      ::push_back(pvVar21,&local_580);
      if (out_mesh._4_4_ ==
          *(uint *)&(source_mesh_map_local->
                    super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        local_594 = 3;
      }
      else {
        local_594 = 0;
      }
      std::vector<aiFace,_std::allocator<aiFace>_>::~vector
                ((vector<aiFace,_std::allocator<aiFace>_> *)&c_1);
    } while (local_594 == 0);
    if (pVVar24 != (VertexWeightTable *)0x0) {
      ppVar3 = pVVar24[-1].
               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      this_01 = pVVar24 + (long)ppVar3;
      while (pVVar24 != this_01) {
        this_01 = this_01 + -1;
        std::
        vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
        ~vector(this_01);
      }
      operator_delete__(&pVVar24[-1].
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)ppVar3 * 0x18 + 8)
      ;
    }
    pvVar21 = source_mesh_map_local;
    if (source_mesh_map_local !=
        (vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
         *)0x0) {
      aiMesh::~aiMesh((aiMesh *)source_mesh_map_local);
      operator_delete(pvVar21,0x520);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
  }
  else {
    pVar41 = std::make_pair<aiMesh*&,unsigned_int&>
                       ((aiMesh **)&source_mesh_map_local,(uint *)((long)&in_mesh_local + 4));
    local_38.first = pVar41.first;
    local_38.second = pVar41.second;
    std::
    vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>::
    push_back(source_mesh_map,&local_38);
  }
  return;
}

Assistant:

void MeshSplitter :: SplitMesh(unsigned int a, aiMesh* in_mesh, std::vector<std::pair<aiMesh*, unsigned int> >& source_mesh_map) {
	// TODO: should better use std::(multi)set for source_mesh_map.

	if (in_mesh->mNumVertices <= LIMIT)	{
		source_mesh_map.push_back(std::make_pair(in_mesh,a));
		return;
	}

	// build a per-vertex weight list if necessary
	VertexWeightTable* avPerVertexWeights = ComputeVertexBoneWeightTable(in_mesh);

	// we need to split this mesh into sub meshes. Estimate submesh size
	const unsigned int sub_meshes = (in_mesh->mNumVertices / LIMIT) + 1;

	// create a std::vector<unsigned int> to remember which vertices have already 
	// been copied and to which position (i.e. output index)
	std::vector<unsigned int> was_copied_to;
	was_copied_to.resize(in_mesh->mNumVertices,WAS_NOT_COPIED);

	// Try to find a good estimate for the number of output faces
	// per mesh. Add 12.5% as buffer
	unsigned int size_estimated = in_mesh->mNumFaces / sub_meshes;
	size_estimated += size_estimated / 8;

	// now generate all submeshes
	unsigned int base = 0;
	while (true) {
		const unsigned int out_vertex_index = LIMIT;

		aiMesh* out_mesh = new aiMesh();			
		out_mesh->mNumVertices = 0;
		out_mesh->mMaterialIndex = in_mesh->mMaterialIndex;

		// the name carries the adjacency information between the meshes
		out_mesh->mName = in_mesh->mName;

		typedef std::vector<aiVertexWeight> BoneWeightList;
		if (in_mesh->HasBones())	{
			out_mesh->mBones = new aiBone*[in_mesh->mNumBones]();
		}

		// clear the temporary helper array
		if (base)	{
			std::fill(was_copied_to.begin(), was_copied_to.end(), WAS_NOT_COPIED);
		}

		std::vector<aiFace> vFaces;

		// reserve enough storage for most cases
		if (in_mesh->HasPositions()) {
			out_mesh->mVertices = new aiVector3D[out_vertex_index];
		}

		if (in_mesh->HasNormals()) {
			out_mesh->mNormals = new aiVector3D[out_vertex_index];
		}

		if (in_mesh->HasTangentsAndBitangents())	{
			out_mesh->mTangents = new aiVector3D[out_vertex_index];
			out_mesh->mBitangents = new aiVector3D[out_vertex_index];
		}

		for (unsigned int c = 0; in_mesh->HasVertexColors(c);++c)	{
			out_mesh->mColors[c] = new aiColor4D[out_vertex_index];
		}

		for (unsigned int c = 0; in_mesh->HasTextureCoords(c);++c)	{
			out_mesh->mNumUVComponents[c] = in_mesh->mNumUVComponents[c];
			out_mesh->mTextureCoords[c] = new aiVector3D[out_vertex_index];
		}
		vFaces.reserve(size_estimated);

		// (we will also need to copy the array of indices)
		while (base < in_mesh->mNumFaces) {
			const unsigned int iNumIndices = in_mesh->mFaces[base].mNumIndices;

			// doesn't catch degenerates but is quite fast
			unsigned int iNeed = 0;
			for (unsigned int v = 0; v < iNumIndices;++v)	{
				unsigned int index = in_mesh->mFaces[base].mIndices[v];

				// check whether we do already have this vertex
				if (WAS_NOT_COPIED == was_copied_to[index])	{
					iNeed++; 
				}
			}
			if (out_mesh->mNumVertices + iNeed > out_vertex_index)	{
				// don't use this face
				break;
			}

			vFaces.push_back(aiFace());
			aiFace& rFace = vFaces.back();

			// setup face type and number of indices
			rFace.mNumIndices = iNumIndices;
			rFace.mIndices = new unsigned int[iNumIndices];

			// need to update the output primitive types
			switch (rFace.mNumIndices)
			{
			case 1:
				out_mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
				break;
			case 2:
				out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
				break;
			case 3:
				out_mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
				break;
			default:
				out_mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
			}

			// and copy the contents of the old array, offset them by current base
			for (unsigned int v = 0; v < iNumIndices;++v) {
				const unsigned int index = in_mesh->mFaces[base].mIndices[v];

				// check whether we do already have this vertex
				if (WAS_NOT_COPIED != was_copied_to[index]) {
					rFace.mIndices[v] = was_copied_to[index];
					continue;
				}

				// copy positions
				out_mesh->mVertices[out_mesh->mNumVertices] = (in_mesh->mVertices[index]);

				// copy normals
				if (in_mesh->HasNormals()) {
					out_mesh->mNormals[out_mesh->mNumVertices] = (in_mesh->mNormals[index]);
				}

				// copy tangents/bi-tangents
				if (in_mesh->HasTangentsAndBitangents()) {
					out_mesh->mTangents[out_mesh->mNumVertices] = (in_mesh->mTangents[index]);
					out_mesh->mBitangents[out_mesh->mNumVertices] = (in_mesh->mBitangents[index]);
				}

				// texture coordinates
				for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
					if (in_mesh->HasTextureCoords( c)) {
						out_mesh->mTextureCoords[c][out_mesh->mNumVertices] = in_mesh->mTextureCoords[c][index];
					}
				}
				// vertex colors 
				for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_COLOR_SETS;++c) {
					if (in_mesh->HasVertexColors( c)) {
						out_mesh->mColors[c][out_mesh->mNumVertices] = in_mesh->mColors[c][index];
					}
				}
				// check whether we have bone weights assigned to this vertex
				rFace.mIndices[v] = out_mesh->mNumVertices;
				if (avPerVertexWeights) {
					VertexWeightTable& table = avPerVertexWeights[ out_mesh->mNumVertices ];
					for (VertexWeightTable::const_iterator iter = table.begin(), end = table.end(); iter != end;++iter) {
						// allocate the bone weight array if necessary and store it in the mBones field (HACK!)
						BoneWeightList* weight_list = reinterpret_cast<BoneWeightList*>(out_mesh->mBones[(*iter).first]);
						if (!weight_list) {
							weight_list = new BoneWeightList();
							out_mesh->mBones[(*iter).first] = reinterpret_cast<aiBone*>(weight_list);
						}
						weight_list->push_back(aiVertexWeight(out_mesh->mNumVertices,(*iter).second));
					}
				}

				was_copied_to[index] = out_mesh->mNumVertices;
				out_mesh->mNumVertices++;
			}
			base++;
			if(out_mesh->mNumVertices == out_vertex_index) {
				// break here. The face is only added if it was complete
				break;
			}
		}

		// check which bones we'll need to create for this submesh
		if (in_mesh->HasBones()) {
			aiBone** ppCurrent = out_mesh->mBones;
			for (unsigned int k = 0; k < in_mesh->mNumBones;++k) {
				// check whether the bone exists
				BoneWeightList* const weight_list = reinterpret_cast<BoneWeightList*>(out_mesh->mBones[k]);

				if (weight_list) {
					const aiBone* const bone_in = in_mesh->mBones[k];
					aiBone* const bone_out = new aiBone();
					*ppCurrent++ = bone_out;
					bone_out->mName = aiString(bone_in->mName);
					bone_out->mOffsetMatrix =bone_in->mOffsetMatrix;
					bone_out->mNumWeights = (unsigned int)weight_list->size();
					bone_out->mWeights = new aiVertexWeight[bone_out->mNumWeights];

					// copy the vertex weights
					::memcpy(bone_out->mWeights, &(*weight_list)[0],bone_out->mNumWeights * sizeof(aiVertexWeight));

					delete weight_list;
					out_mesh->mNumBones++;
				}
			}
		}

		// copy the face list to the mesh
		out_mesh->mFaces = new aiFace[vFaces.size()];
		out_mesh->mNumFaces = (unsigned int)vFaces.size();

		for (unsigned int p = 0; p < out_mesh->mNumFaces;++p) {
			out_mesh->mFaces[p] = vFaces[p];
		}

		// add the newly created mesh to the list
		source_mesh_map.push_back(std::make_pair(out_mesh,a));

		if (base == in_mesh->mNumFaces) {
			break;
		}
	}

	// delete the per-vertex weight list again
	delete[] avPerVertexWeights;

	// now delete the old mesh data
	delete in_mesh;
}